

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O2

float __thiscall gui::Theme::computeTextMaxHeightRatio(Theme *this,Font *font)

{
  uint uVar1;
  char c;
  char cVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar3;
  locale local_1f0 [8];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1c8;
  string characterSample;
  Text text;
  
  std::__cxx11::string::string((string *)&characterSample,"",(allocator *)&text);
  for (cVar2 = ' '; cVar2 != '\x7f'; cVar2 = cVar2 + '\x01') {
    std::__cxx11::string::push_back((char)&characterSample);
  }
  std::locale::locale(local_1f0);
  sf::String::String((String *)&local_1c8,&characterSample,local_1f0);
  sf::Text::Text(&text,(String *)&local_1c8,font,0x1e);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_1c8);
  std::locale::~locale(local_1f0);
  FVar3 = sf::Text::getLocalBounds(&text);
  fStack_1e0 = (float)extraout_XMM0_Dc;
  local_1e8 = (undefined1  [8])FVar3._0_8_;
  fStack_1dc = (float)extraout_XMM0_Dd;
  local_1d8._8_4_ = in_XMM1_Dc;
  local_1d8._0_8_ = FVar3._8_8_;
  local_1d8._12_4_ = in_XMM1_Dd;
  uVar1 = sf::Text::getCharacterSize(&text);
  local_1e8._4_4_ = (float)local_1e8._4_4_ + (float)local_1d8._4_4_;
  local_1e8._0_4_ = (float)local_1e8._4_4_ / (float)uVar1;
  fStack_1e0 = (float)local_1e8._4_4_;
  fStack_1dc = (float)local_1e8._4_4_;
  sf::Text::~Text(&text);
  std::__cxx11::string::~string((string *)&characterSample);
  return (float)local_1e8._0_4_;
}

Assistant:

float Theme::computeTextMaxHeightRatio(const sf::Font& font) const {
    std::string characterSample = "";
    for (char c = '\u0020'; c < '\u007f'; ++c) {
        characterSample.push_back(c);
    }
    GUI_DEBUG << "characterSample = [" << characterSample << "]\n";

    sf::Text text(characterSample, font);
    const auto bounds = text.getLocalBounds();
    return (bounds.top + bounds.height) / text.getCharacterSize();
}